

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontalbitpacking.cpp
# Opt level: O0

void FastPForLib::simdhunpack(uint8_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  uint in_EDX;
  uint32_t *in_RSI;
  uint8_t *in_RDI;
  uint32_t *in_stack_00000010;
  uint8_t *in_stack_00000018;
  undefined4 in_stack_00000020;
  uint32_t *in_stack_ffffffffffffffc8;
  
  switch((uint8_t *)(ulong)in_EDX) {
  case (uint8_t *)0x0:
    SIMD_nullunpacker32((uint8_t *)(ulong)in_EDX,in_stack_ffffffffffffffc8);
    break;
  case (uint8_t *)0x1:
    simdhunpack1(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x2:
    simdhunpack2(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x3:
    simdhunpack3(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x4:
    simdhunpack4(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x5:
    simdhunpack5(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x6:
    simdhunpack6(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x7:
    simdhunpack7(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x8:
    simdhunpack8(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x9:
    simdhunpack9(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xa:
    simdhunpack10(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xb:
    simdhunpack11(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xc:
    simdhunpack12(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xd:
    simdhunpack13(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xe:
    simdhunpack14(in_RDI,in_RSI);
    break;
  case (uint8_t *)0xf:
    simdhunpack15(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x10:
    simdhunpack16(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x11:
    simdhunpack17(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x12:
    simdhunpack18(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x13:
    simdhunpack19(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x14:
    simdhunpack20(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x15:
    simdhunpack21(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x16:
    simdhunpack22(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x17:
    simdhunpack23(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x18:
    simdhunpack24(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x19:
    simdhunpack25(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x1a:
    simdhunpack26(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x1b:
    simdhunpack27(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x1c:
    simdhunpack28(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x1d:
    simdhunpack29((uint8_t *)out,(uint32_t *)CONCAT44(bit,in_stack_00000020));
    break;
  case (uint8_t *)0x1e:
    simdhunpack30(in_RDI,in_RSI);
    break;
  case (uint8_t *)0x1f:
    simdhunpack31(in_stack_00000018,in_stack_00000010);
    break;
  case (uint8_t *)0x20:
    simdhunpack32(in_RDI,in_RSI);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void simdhunpack(const uint8_t *in, uint32_t *out, uint32_t bit) {
  switch (bit) {
  case 0:
    SIMD_nullunpacker32(in, out);
    return;

  case 1:
    simdhunpack1(in, out);
    return;

  case 2:
    simdhunpack2(in, out);
    return;

  case 3:
    simdhunpack3(in, out);
    return;

  case 4:
    simdhunpack4(in, out);
    return;

  case 5:
    simdhunpack5(in, out);
    return;

  case 6:
    simdhunpack6(in, out);
    return;

  case 7:
    simdhunpack7(in, out);
    return;

  case 8:
    simdhunpack8(in, out);
    return;

  case 9:
    simdhunpack9(in, out);
    return;

  case 10:
    simdhunpack10(in, out);
    return;

  case 11:
    simdhunpack11(in, out);
    return;

  case 12:
    simdhunpack12(in, out);
    return;

  case 13:
    simdhunpack13(in, out);
    return;

  case 14:
    simdhunpack14(in, out);
    return;

  case 15:
    simdhunpack15(in, out);
    return;

  case 16:
    simdhunpack16(in, out);
    return;

  case 17:
    simdhunpack17(in, out);
    return;

  case 18:
    simdhunpack18(in, out);
    return;

  case 19:
    simdhunpack19(in, out);
    return;

  case 20:
    simdhunpack20(in, out);
    return;

  case 21:
    simdhunpack21(in, out);
    return;

  case 22:
    simdhunpack22(in, out);
    return;

  case 23:
    simdhunpack23(in, out);
    return;

  case 24:
    simdhunpack24(in, out);
    return;

  case 25:
    simdhunpack25(in, out);
    return;

  case 26:
    simdhunpack26(in, out);
    return;

  case 27:
    simdhunpack27(in, out);
    return;

  case 28:
    simdhunpack28(in, out);
    return;

  case 29:
    simdhunpack29(in, out);
    return;

  case 30:
    simdhunpack30(in, out);
    return;

  case 31:
    simdhunpack31(in, out);
    return;

  case 32:
    simdhunpack32(in, out);
    return;

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}